

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Lms_GiaPrintSubgraph(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pObj_00;
  uint uVar1;
  
  if (((int)(uint)*(undefined8 *)pObj < 0) &&
     (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 != 0x1fffffff)) {
    pObj_00 = pObj + -(ulong)uVar1;
    if ((~*(uint *)pObj_00 & 0x1fffffff) == 0 || (int)*(uint *)pObj_00 < 0) {
      Gia_ObjPrint(p,pObj_00);
    }
    else {
      Lms_ObjAreaMark_rec(pObj_00);
      Lms_GiaPrintSubgraph_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
    }
    Gia_ObjPrint(p,pObj);
    return;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                ,0x11b,"void Lms_GiaPrintSubgraph(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Lms_GiaPrintSubgraph( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCo(pObj) );
    if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
    {
        Lms_ObjAreaMark_rec( Gia_ObjFanin0(pObj) );
        Lms_GiaPrintSubgraph_rec( p, Gia_ObjFanin0(pObj) ); 
    }
    else
        Gia_ObjPrint( p, Gia_ObjFanin0(pObj) );
    Gia_ObjPrint( p, pObj );
}